

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

bool __thiscall cppnet::RWSocket::Send(RWSocket *this)

{
  uint64_t sockfd;
  bool bVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  reference vec;
  size_type sVar5;
  SysCallInt32Result SVar6;
  int *piVar7;
  element_type *peVar8;
  element_type *this_00;
  enable_shared_from_this<cppnet::RWSocket> local_88;
  undefined1 local_78 [8];
  shared_ptr<cppnet::EventActions> actions;
  int local_60;
  int iStack_5c;
  SysCallInt32Result ret;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> io_vec;
  uint32_t local_30;
  uint32_t off_set;
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  RWSocket *this_local;
  
  cppnet_base.super___shared_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::weak_ptr<cppnet::CppNetBase>::lock((weak_ptr<cppnet::CppNetBase> *)&off_set);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&off_set);
  if (bVar1) {
    local_30 = 0;
    do {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_write_buffer);
      bVar1 = false;
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_write_buffer);
        iVar3 = (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
        bVar1 = iVar3 != 0;
      }
      if (!bVar1) {
        this_00 = std::
                  __shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&off_set);
        std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this(&local_88);
        CppNetBase::OnWrite(this_00,(shared_ptr<cppnet::RWSocket> *)&local_88,local_30);
        std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)&local_88);
        this_local._7_1_ = 1;
        break;
      }
      std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::vector
                ((vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)&ret);
      peVar4 = std::
               __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_write_buffer);
      (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[0x11])(peVar4,&ret,0x1000);
      sockfd = (this->super_Socket)._sock;
      actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::begin
                       ((vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)&ret);
      vec = __gnu_cxx::
            __normal_iterator<cppnet::Iovec_*,_std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>_>
            ::operator*((__normal_iterator<cppnet::Iovec_*,_std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>_>
                         *)&actions.
                            super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      sVar5 = std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::size
                        ((vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)&ret);
      SVar6 = OsHandle::Writev(sockfd,vec,(uint32_t)sVar5);
      local_60 = SVar6._return_value;
      if ((local_60 < 0) || (iStack_5c = SVar6._errno, iStack_5c != 0)) {
        piVar7 = __errno_location();
        if ((*piVar7 == 0xb) ||
           ((piVar7 = __errno_location(), *piVar7 == 0xb ||
            (piVar7 = __errno_location(), *piVar7 == 4)))) {
          Socket::GetEventActions((Socket *)local_78);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
          if (bVar1) {
            peVar8 = std::
                     __shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_78);
            iVar3 = (*peVar8->_vptr_EventActions[4])(peVar8,this->_event);
            this_local._7_1_ = (byte)iVar3 & 1;
          }
          else {
            this_local._7_1_ = 0;
          }
          bVar1 = true;
          std::shared_ptr<cppnet::EventActions>::~shared_ptr
                    ((shared_ptr<cppnet::EventActions> *)local_78);
        }
        else {
          piVar7 = __errno_location();
          if (*piVar7 == 0x4a) {
            (*(this->super_Socket)._vptr_Socket[0x11])(this,2);
            this_local._7_1_ = 0;
            bVar1 = true;
          }
          else {
            (*(this->super_Socket)._vptr_Socket[0x11])(this,1);
            this_local._7_1_ = 0;
            bVar1 = true;
          }
        }
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_write_buffer);
        (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[6])
                  (peVar4,(ulong)SVar6 & 0xffffffff);
        local_30 = local_60 + local_30;
        bVar1 = false;
      }
      std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::~vector
                ((vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *)&ret);
    } while (!bVar1);
  }
  else {
    this_local._7_1_ = 0;
  }
  std::shared_ptr<cppnet::CppNetBase>::~shared_ptr((shared_ptr<cppnet::CppNetBase> *)&off_set);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RWSocket::Send() {
    auto cppnet_base = _cppnet_base.lock();
    if (!cppnet_base) {
        return false;
    }

    uint32_t off_set = 0;
    while(_write_buffer && _write_buffer->GetCanReadLength() > 0) {
        std::vector<Iovec> io_vec;
        _write_buffer->GetUseMemoryBlock(io_vec, __linux_write_buff_get);
        auto ret = OsHandle::Writev(_sock, &*io_vec.begin(), io_vec.size());
        if (ret._return_value >= 0 && ret._errno == 0) {
            _write_buffer->MoveReadPt(ret._return_value);
            off_set += ret._return_value;

        } else {
            if (errno == EWOULDBLOCK || errno == EAGAIN || errno == EINTR) {
                //can't send complete
                auto actions = GetEventActions();
                if (actions) {
                    return actions->AddSendEvent(_event);
                }
                return false;

            } else if (errno == EBADMSG) {
                OnDisConnect(CEC_CONNECT_BREAK);
                return false;

            } else {
                OnDisConnect(CEC_CLOSED);
                return false;
            }
        }
    }
    cppnet_base->OnWrite(shared_from_this(), off_set);
    return true;
}